

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> * __thiscall
testing::internal::TypedExpectation<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>::
GetCurrentAction(TypedExpectation<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>
                 *this,FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>
                       *mocker,ArgumentTuple *args)

{
  int iVar1;
  ostream *poVar2;
  TypedExpectation<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *pTVar3;
  char *pcVar4;
  int iVar5;
  string sStack_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  iVar1 = ExpectationBase::call_count((ExpectationBase *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
             (allocator<char> *)&sStack_1d8);
  Assert(0 < iVar1,
         "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/../thirdparty/gmock/gmock.h"
         ,0x25f5,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  iVar5 = (int)((ulong)(*(long *)(this + 0x90) - *(long *)(this + 0x88)) >> 3);
  if (((0 < iVar5) && (iVar5 < iVar1)) &&
     (this[0xa1] ==
      (TypedExpectation<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>)0x0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    ExpectationBase::DescribeLocationTo((ExpectationBase *)this,local_1a8);
    poVar2 = std::operator<<(local_1a8,"Actions ran out in ");
    poVar2 = std::operator<<(poVar2,*(char **)(this + 0x18));
    poVar2 = std::operator<<(poVar2,"...\n");
    poVar2 = std::operator<<(poVar2,"Called ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," times, but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
    poVar2 = std::operator<<(poVar2," WillOnce()");
    pcVar4 = "s are";
    if (iVar5 == 1) {
      pcVar4 = " is";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2," specified - ");
    FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>::
    DescribeDefaultActionTo(mocker,args,local_1a8);
    std::__cxx11::stringbuf::str();
    Log(kWarning,&sStack_1d8,1);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  if (iVar5 < iVar1) {
    pTVar3 = this + 0x150;
  }
  else {
    pTVar3 = *(TypedExpectation<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> **)
              (*(long *)(this + 0x88) + -8 + (long)iVar1 * 8);
  }
  return (Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)pTVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count ?
        *static_cast<const Action<F>*>(untyped_actions_[count - 1]) :
        repeated_action();
  }